

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split_inl.hpp
# Opt level: O0

bool CLI::detail::split_short(string *current,string *name,string *rest)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  string *rest_local;
  string *name_local;
  string *current_local;
  
  local_28 = rest;
  rest_local = name;
  name_local = current;
  uVar2 = ::std::__cxx11::string::size();
  if ((1 < uVar2) &&
     (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name_local), *pcVar3 == '-')) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name_local);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)local_48,(ulong)name_local);
      ::std::__cxx11::string::operator=((string *)rest_local,local_48);
      ::std::__cxx11::string::~string(local_48);
      ::std::__cxx11::string::substr((ulong)local_68,(ulong)name_local);
      ::std::__cxx11::string::operator=((string *)local_28,local_68);
      ::std::__cxx11::string::~string(local_68);
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_short(const std::string &current, std::string &name, std::string &rest) {
    if(current.size() > 1 && current[0] == '-' && valid_first_char(current[1])) {
        name = current.substr(1, 1);
        rest = current.substr(2);
        return true;
    }
    return false;
}